

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sem.c
# Opt level: O0

int nn_sem_wait(nn_sem *self)

{
  FILE *__stream;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint *puVar4;
  bool bVar5;
  int rc;
  nn_sem *self_local;
  
  iVar1 = sem_wait((sem_t *)self);
  bVar5 = false;
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    bVar5 = *piVar2 == 4;
  }
  __stream = _stderr;
  if (bVar5) {
    self_local._4_4_ = -4;
  }
  else {
    if (iVar1 != 0) {
      piVar2 = __errno_location();
      pcVar3 = nn_err_strerror(*piVar2);
      puVar4 = (uint *)__errno_location();
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)*puVar4,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/utils/sem.c"
              ,0xa2);
      fflush(_stderr);
      nn_err_abort();
    }
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

int nn_sem_wait (struct nn_sem *self)
{
    int rc;

    rc = sem_wait (&self->sem);
    if (nn_slow (rc < 0 && errno == EINTR))
        return -EINTR;
    errno_assert (rc == 0);
    return 0;
}